

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcMaj3.c
# Opt level: O3

Vec_Wrd_t * Zyx_TestCreateTruthTables(int nVars,int nNodes)

{
  word wVar1;
  byte bVar2;
  uint uVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  int iVar6;
  Vec_Wrd_t *pVVar7;
  word *__s;
  long lVar8;
  word *pwVar9;
  int nWords;
  ulong uVar10;
  uint uVar11;
  ulong uVar12;
  ulong uVar13;
  int iVar14;
  undefined1 auVar15 [16];
  int iVar16;
  long lVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  
  __s = (word *)0x0;
  uVar3 = 1 << ((byte)(nVars - 6U) & 0x1f);
  if (nVars < 7) {
    uVar3 = 1;
  }
  pwVar9 = (word *)(ulong)(nVars - 6U);
  if (nVars < 7) {
    pwVar9 = __s;
  }
  iVar14 = nVars + 1 + nNodes << ((byte)pwVar9 & 0x1f);
  pVVar7 = (Vec_Wrd_t *)malloc(0x10);
  iVar6 = 0x10;
  if (0xe < iVar14 - 1U) {
    iVar6 = iVar14;
  }
  pVVar7->nCap = iVar6;
  if (iVar6 != 0) {
    __s = (word *)malloc((long)iVar6 << 3);
  }
  pVVar7->pArray = __s;
  pVVar7->nSize = iVar14;
  memset(__s,0,(long)iVar14 << 3);
  auVar5 = _DAT_00912220;
  auVar4 = _DAT_00912210;
  if (0 < nVars) {
    lVar8 = (ulong)uVar3 - 1;
    auVar15._8_4_ = (int)lVar8;
    auVar15._0_8_ = lVar8;
    auVar15._12_4_ = (int)((ulong)lVar8 >> 0x20);
    uVar10 = 0;
    auVar15 = auVar15 ^ _DAT_00912220;
    do {
      bVar2 = (byte)pwVar9 & 0x1f;
      uVar11 = (int)uVar10 << bVar2;
      if (((int)uVar10 << bVar2 < 0) || (iVar14 <= (int)uVar11)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecWrd.h"
                      ,0x19d,"word *Vec_WrdEntryP(Vec_Wrd_t *, int)");
      }
      uVar12 = (ulong)uVar11;
      iVar6 = auVar15._4_4_;
      iVar16 = auVar15._12_4_;
      if (uVar10 < 6) {
        if (0 < (int)uVar3) {
          wVar1 = s_Truths6[uVar10];
          lVar8 = 0;
          auVar19 = auVar4;
          do {
            auVar18 = auVar19 ^ auVar5;
            if ((bool)(~(iVar6 < auVar18._4_4_ ||
                        auVar15._0_4_ < auVar18._0_4_ && auVar18._4_4_ == iVar6) & 1)) {
              *(word *)((long)__s + lVar8 + uVar12 * 8) = wVar1;
            }
            if (auVar18._12_4_ <= iVar16 &&
                (auVar18._8_4_ <= auVar15._8_4_ || auVar18._12_4_ != iVar16)) {
              *(word *)((long)__s + lVar8 + uVar12 * 8 + 8) = wVar1;
            }
            lVar17 = auVar19._8_8_;
            auVar19._0_8_ = auVar19._0_8_ + 2;
            auVar19._8_8_ = lVar17 + 2;
            lVar8 = lVar8 + 0x10;
          } while ((ulong)(uVar3 + 1 >> 1) << 4 != lVar8);
        }
      }
      else if (0 < (int)uVar3) {
        uVar11 = 1 << ((char)uVar10 - 6U & 0x1f);
        uVar13 = 0;
        auVar18 = auVar4;
        do {
          auVar19 = auVar18 ^ auVar5;
          if ((bool)(~(iVar6 < auVar19._4_4_ ||
                      auVar15._0_4_ < auVar19._0_4_ && auVar19._4_4_ == iVar6) & 1)) {
            __s[uVar12 + uVar13] = -(ulong)((uVar11 & (uint)uVar13) != 0);
          }
          if (auVar19._12_4_ <= iVar16 &&
              (auVar19._8_4_ <= auVar15._8_4_ || auVar19._12_4_ != iVar16)) {
            __s[uVar12 + uVar13 + 1] = -(ulong)(((uint)uVar13 + 1 & uVar11) != 0);
          }
          uVar13 = uVar13 + 2;
          lVar8 = auVar18._8_8_;
          auVar18._0_8_ = auVar18._0_8_ + 2;
          auVar18._8_8_ = lVar8 + 2;
        } while ((uVar3 + 1 & 0xfffffffe) != uVar13);
      }
      uVar10 = uVar10 + 1;
    } while (uVar10 != (uint)nVars);
  }
  return pVVar7;
}

Assistant:

Vec_Wrd_t * Zyx_TestCreateTruthTables( int nVars, int nNodes )
{
    int i, nWords = Abc_TtWordNum(nVars);
    Vec_Wrd_t * vInfo = Vec_WrdStart( nWords * (nVars + nNodes + 1) ); 
    for ( i = 0; i < nVars; i++ )
        Abc_TtIthVar( Zyx_TestTruth(vInfo, i, nWords), i, nVars );
    //Dau_DsdPrintFromTruth( Maj3_ManTruth(p, p->nObjs), p->nVars );
    return vInfo;
}